

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpndrv.h
# Opt level: O1

CTcPrsNode * __thiscall CTPNIfBase::adjust_for_dyn(CTPNIfBase *this,tcpn_dyncomp_info *info)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  iVar1 = (*(this->first_->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0x11])();
  this->first_ = (CTcPrsNode *)CONCAT44(extraout_var,iVar1);
  iVar1 = (*(this->second_->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0x11])(this->second_,info);
  this->second_ = (CTcPrsNode *)CONCAT44(extraout_var_00,iVar1);
  iVar1 = (*(this->third_->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0x11])(this->third_,info);
  this->third_ = (CTcPrsNode *)CONCAT44(extraout_var_01,iVar1);
  return &this->super_CTcPrsNode;
}

Assistant:

class CTcPrsNode *adjust_for_dyn(const tcpn_dyncomp_info *info)
    {
        /* adjust my subexpressions */
        first_ = first_->adjust_for_dyn(info);
        second_ = second_->adjust_for_dyn(info);
        third_ = third_->adjust_for_dyn(info);

        /* return myself otherwise unchanged */
        return this;
    }